

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::base_widget::render(base_widget *this,form_context *context)

{
  uint uVar1;
  ostream *out;
  ostream *poVar2;
  char *pcVar3;
  streamable sStack_118;
  escape local_f8;
  streamable local_d0;
  basic_message<char> local_b0;
  
  auto_generate(this,context);
  out = form_context::out(context);
  uVar1 = context->html_list_type_;
  if ((ulong)uVar1 < 4) {
    std::operator<<(out,&DAT_00267520 + *(int *)(&DAT_00267520 + (ulong)uVar1 * 4));
  }
  if ((this->field_0x1f0 & 0x20) == 0) {
    if (uVar1 == 1) {
LAB_00223512:
      std::operator<<(out,"&nbsp;");
    }
  }
  else {
    if ((this->id_)._M_string_length == 0) {
      booster::locale::basic_message<char>::basic_message(&local_b0,&this->message_);
      filters::streamable::streamable<booster::locale::basic_message<char>>(&sStack_118,&local_b0);
      filters::escape::escape(&local_f8,&sStack_118);
      filters::escape::operator()(&local_f8,out);
      filters::escape::~escape(&local_f8);
      filters::streamable::~streamable(&sStack_118);
      booster::locale::basic_message<char>::~basic_message(&local_b0);
    }
    else {
      poVar2 = std::operator<<(out,"<label for=\"");
      std::__cxx11::string::string((string *)&sStack_118,(string *)&this->id_);
      poVar2 = std::operator<<(poVar2,(string *)&sStack_118);
      poVar2 = std::operator<<(poVar2,"\">");
      booster::locale::basic_message<char>::basic_message(&local_b0,&this->message_);
      filters::streamable::streamable<booster::locale::basic_message<char>>(&local_d0,&local_b0);
      filters::escape::escape(&local_f8,&local_d0);
      filters::escape::operator()(&local_f8,poVar2);
      std::operator<<(poVar2,"</label>");
      filters::escape::~escape(&local_f8);
      filters::streamable::~streamable(&local_d0);
      booster::locale::basic_message<char>::~basic_message(&local_b0);
      std::__cxx11::string::~string((string *)&sStack_118);
    }
    if ((uVar1 & 0xfffffffd) != 1) goto LAB_00223512;
  }
  if (context->html_list_type_ == 1) {
    pcVar3 = "</th><td>";
LAB_00223606:
    std::operator<<(out,pcVar3);
  }
  else if (context->html_list_type_ == 3) {
    pcVar3 = "</dt><dd>";
    goto LAB_00223606;
  }
  if ((this->field_0x1f0 & 1) == 0) {
    std::operator<<(out,"<span class=\"cppcms_form_error\">");
    if ((this->field_0x1f0 & 0x40) == 0) {
      std::operator<<(out,"*");
    }
    else {
      booster::locale::basic_message<char>::basic_message(&local_b0,&this->error_message_);
      filters::streamable::streamable<booster::locale::basic_message<char>>(&sStack_118,&local_b0);
      filters::escape::escape(&local_f8,&sStack_118);
      filters::escape::operator()(&local_f8,out);
      filters::escape::~escape(&local_f8);
      filters::streamable::~streamable(&sStack_118);
      booster::locale::basic_message<char>::~basic_message(&local_b0);
    }
    pcVar3 = "</span> ";
  }
  else {
    if (uVar1 != 1) goto LAB_002236b4;
    pcVar3 = "&nbsp;";
  }
  std::operator<<(out,pcVar3);
LAB_002236b4:
  std::operator<<(out,"<span class=\"cppcms_form_input\">");
  context->widget_part_type_ = 0;
  (*(this->super_base_form)._vptr_base_form[8])(this,context);
  std::operator<<(out,(string *)&this->attr_);
  context->widget_part_type_ = 1;
  (*(this->super_base_form)._vptr_base_form[8])(this,context);
  std::operator<<(out,"</span>");
  if ((this->field_0x1f0 & 0x80) != 0) {
    poVar2 = std::operator<<(out,"<span class=\"cppcms_form_help\">");
    booster::locale::basic_message<char>::basic_message(&local_b0,&this->help_);
    filters::streamable::streamable<booster::locale::basic_message<char>>(&sStack_118,&local_b0);
    filters::escape::escape(&local_f8,&sStack_118);
    filters::escape::operator()(&local_f8,poVar2);
    std::operator<<(poVar2,"</span>");
    filters::escape::~escape(&local_f8);
    filters::streamable::~streamable(&sStack_118);
    booster::locale::basic_message<char>::~basic_message(&local_b0);
  }
  if ((ulong)context->html_list_type_ < 5) {
    std::operator<<(out,&DAT_00267530 +
                        *(int *)(&DAT_00267530 + (ulong)context->html_list_type_ * 4));
  }
  return;
}

Assistant:

void base_widget::render(form_context &context)
{
	auto_generate(&context);
	std::ostream &output = context.out();
	html_list_type type = context.html_list();
	switch(type) {
	case as_p: output<<"<p>"; break;
	case as_table: output<<"<tr><th>"; break;
	case as_ul: output<<"<li>"; break;
	case as_dl: output<<"<dt>"; break;
	default: ;
	}
	
	if(has_message()) {
		if(id_.empty())
			output << filters::escape(message());
		else
			output<<"<label for=\"" << id() << "\">" << filters::escape(message()) <<"</label>";
		if(type!=as_table && type!=as_dl)
			output << "&nbsp;";
	}
	else if(type == as_table) {
		output<<"&nbsp;";
	}
	switch(context.html_list()) {
	case as_table: output<<"</th><td>"; break;
	case as_dl: output<<"</dt><dd>"; break;
	default: ;
	}

	if(!valid()) {
		output<<"<span class=\"cppcms_form_error\">";
		if(has_error_message())
			output<<filters::escape(error_message());
		else
			output<<"*";
		output<<"</span> ";
	}
	else if(type == as_table){
		output<<"&nbsp;";
	}
	output<<"<span class=\"cppcms_form_input\">";
	context.widget_part(first_part);
	render_input(context);
	output<<attr_;
	context.widget_part(second_part);
	render_input(context);
	output<<"</span>";

	if(has_help()) {
		output<<"<span class=\"cppcms_form_help\">"<<filters::escape(help())<<"</span>";
	}
		
	switch(context.html_list()) {
	case as_p: output<<"</p>\n"; break;
	case as_table: output<<"</td></tr>\n"; break;
	case as_ul: output<<"</li>\n"; break;
	case as_dl: output<<"</dd>\n"; break;
	case as_space: output<<"\n";
	default: ;
	}
}